

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O3

int __thiscall QSqlTableModelPrivate::nameToIndex(QSqlTableModelPrivate *this,QString *name)

{
  int iVar1;
  long in_FS_OFFSET;
  QAnyStringView name_00;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  strippedFieldName(&local_30,this,name);
  name_00.m_size = local_30.d.size | 0x8000000000000000;
  name_00.field_0.m_data_utf16 = local_30.d.ptr;
  iVar1 = QSqlRecord::indexOf(&(this->super_QSqlQueryModelPrivate).rec,name_00);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QSqlTableModelPrivate::nameToIndex(const QString &name) const
{
    return rec.indexOf(strippedFieldName(name));
}